

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * __thiscall
units::getMultiplierString_abi_cxx11_
          (string *__return_storage_ptr__,units *this,double multiplier,bool numOnly)

{
  bool bVar1;
  const_iterator cVar2;
  allocator local_1b9;
  __string_type rv;
  stringstream ss;
  long local_180;
  undefined8 local_178 [46];
  
  if ((multiplier == 1.0) && (!NAN(multiplier))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  if ((char)this == '\0') {
    _ss = (float)multiplier;
    cVar2 = std::
            _Hashtable<float,_std::pair<const_float,_char>,_std::allocator<std::pair<const_float,_char>_>,_std::__detail::_Select1st,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<float,_std::pair<const_float,_char>,_std::allocator<std::pair<const_float,_char>_>,_std::__detail::_Select1st,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)si_prefixes,(key_type *)&ss);
    if (cVar2.super__Node_iterator_base<std::pair<const_float,_char>,_false>._M_cur !=
        (__node_type *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(undefined8 *)((long)local_178 + *(long *)(local_180 + -0x18)) = 0x12;
  std::ostream::_M_insert<double>(multiplier);
  std::__cxx11::stringbuf::str();
  if (rv._M_string_length < 5) {
    bVar1 = std::operator==(&rv,"inf");
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"1.00000000000000*(infinity)",&local_1b9);
      goto LAB_00172d18;
    }
    bVar1 = std::operator==(&rv,"-inf");
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"1.00000000000000*(-1.00000000000000*infinity)",
                 &local_1b9);
      goto LAB_00172d18;
    }
    bVar1 = std::operator==(&rv,"nan");
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"1.00000000000000*(nan)",&local_1b9);
      goto LAB_00172d18;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rv._M_dataplus._M_p == &rv.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(rv.field_2._M_allocated_capacity._1_7_,rv.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = rv.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = rv._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(rv.field_2._M_allocated_capacity._1_7_,rv.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = rv._M_string_length;
  rv._M_string_length = 0;
  rv.field_2._M_local_buf[0] = '\0';
  rv._M_dataplus._M_p = (pointer)&rv.field_2;
LAB_00172d18:
  std::__cxx11::string::~string((string *)&rv);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

static std::string getMultiplierString(double multiplier, bool numOnly = false)
{
    if (multiplier == 1.0) {
        return {};
    }
    if (!numOnly) {
        auto si = si_prefixes.find(static_cast<float>(multiplier));
        if (si != si_prefixes.end()) {
            // NOLINTNEXTLINE(
            return std::string(1UL, si->second);
        }
    }
    int P = 18;  // the desired precision
    std::stringstream ss;

    ss << std::setprecision(P) << multiplier;
    auto rv = ss.str();
    if (rv.size() <= 4) {
        // modify some improper strings that cause issues later on
        // some platforms don't produce these
        if (rv == "inf") {
            return "1.00000000000000*(infinity)";  // LCOV_EXCL_LINE
        }
        if (rv == "-inf") {
            return "1.00000000000000*(-1.00000000000000*infinity)";  // LCOV_EXCL_LINE
        }
        if (rv == "nan") {
            return "1.00000000000000*(nan)";  // LCOV_EXCL_LINE
        }
    }
    return rv;
}